

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreLowerPeeps.cpp
# Opt level: O0

Instr * __thiscall Lowerer::PeepBrBool(Lowerer *this,Instr *instrBr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  Instr *this_00;
  Opnd *pOVar4;
  RegOpnd *pRVar5;
  Instr *this_01;
  Instr *this_02;
  BranchInstr *pBVar6;
  LabelInstr *targetInstr;
  undefined4 *puVar7;
  LabelInstr *local_d8;
  LabelInstr *local_c8;
  Lowerer *local_78;
  BranchInstr *instrBr2;
  BranchInstr *instrBr1;
  LabelInstr *trueLabel;
  LabelInstr *falseLabel;
  RegOpnd *cm1DstReg;
  RegOpnd *cm2DstReg;
  RegOpnd *src1Reg;
  Instr *instrCm2;
  Instr *instrCm1;
  Instr *instrBinOp;
  Opnd *src1;
  Instr *instrBr_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::GetSrc1(instrBr);
  bVar2 = IR::Opnd::IsRegOpnd(pOVar3);
  this_local = (Lowerer *)instrBr;
  if (bVar2) {
    bVar2 = IR::Instr::HasBailOutInfo(instrBr);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                         ,0x130,"(!instrBr->HasBailOutInfo())","!instrBr->HasBailOutInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this_00 = IR::Instr::GetPrevRealInstrOrLabel(instrBr);
    if ((this_00->m_opcode == And_I4) || (this_00->m_opcode == Or_I4)) {
      pOVar4 = IR::Instr::GetDst(this_00);
      bVar2 = IR::Opnd::IsEqual(pOVar4,pOVar3);
      if (bVar2) {
        pRVar5 = IR::Opnd::AsRegOpnd(pOVar3);
        bVar2 = StackSym::IsSingleDef(pRVar5->m_sym);
        if ((bVar2) && (bVar2 = IR::Opnd::GetIsDead(&pRVar5->super_Opnd), bVar2)) {
          bVar2 = IR::Instr::HasBailOutInfo(this_00);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                               ,0x140,"(!instrBinOp->HasBailOutInfo())",
                               "!instrBinOp->HasBailOutInfo()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          this_01 = IR::Instr::GetPrevRealInstrOrLabel(this_00);
          bVar2 = IR::Instr::IsCmCC_I4(this_01);
          if (bVar2) {
            pOVar3 = IR::Instr::GetDst(this_01);
            pRVar5 = IR::Opnd::AsRegOpnd(pOVar3);
            bVar2 = StackSym::IsSingleDef(pRVar5->m_sym);
            if (bVar2) {
              pOVar3 = IR::Instr::GetSrc1(this_00);
              bVar2 = IR::Opnd::IsEqual(&pRVar5->super_Opnd,pOVar3);
              if (bVar2) {
                pOVar3 = IR::Instr::GetSrc1(this_00);
                pRVar5 = IR::Opnd::AsRegOpnd(pOVar3);
                bVar2 = IR::Opnd::GetIsDead(&pRVar5->super_Opnd);
              }
              else {
                pOVar3 = IR::Instr::GetSrc2(this_00);
                bVar2 = IR::Opnd::IsEqual(&pRVar5->super_Opnd,pOVar3);
                if (!bVar2) {
                  return instrBr;
                }
                pOVar3 = IR::Instr::GetSrc2(this_00);
                pRVar5 = IR::Opnd::AsRegOpnd(pOVar3);
                bVar2 = IR::Opnd::GetIsDead(&pRVar5->super_Opnd);
              }
              if (bVar2) {
                bVar2 = IR::Instr::HasBailOutInfo(this_01);
                if (bVar2) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar7 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                     ,0x15f,"(!instrCm2->HasBailOutInfo())",
                                     "!instrCm2->HasBailOutInfo()");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar7 = 0;
                }
                this_02 = IR::Instr::GetPrevRealInstrOrLabel(this_01);
                bVar2 = IR::Instr::IsCmCC_I4(this_02);
                if (bVar2) {
                  pOVar3 = IR::Instr::GetDst(this_02);
                  pOVar4 = IR::Instr::GetDst(this_01);
                  bVar2 = IR::Opnd::IsEqual(pOVar3,pOVar4);
                  if (bVar2) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar7 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                       ,0x166,"(!instrCm1->GetDst()->IsEqual(instrCm2->GetDst()))",
                                       "!instrCm1->GetDst()->IsEqual(instrCm2->GetDst())");
                    if (!bVar2) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar7 = 0;
                  }
                  pOVar3 = IR::Instr::GetDst(this_02);
                  pRVar5 = IR::Opnd::AsRegOpnd(pOVar3);
                  bVar2 = StackSym::IsSingleDef(pRVar5->m_sym);
                  if (bVar2) {
                    pOVar3 = IR::Instr::GetSrc1(this_01);
                    bVar2 = IR::Opnd::IsEqual(&pRVar5->super_Opnd,pOVar3);
                    if (!bVar2) {
                      pOVar3 = IR::Instr::GetSrc2(this_01);
                      bVar2 = IR::Opnd::IsEqual(&pRVar5->super_Opnd,pOVar3);
                      if (!bVar2) {
                        pOVar3 = IR::Instr::GetSrc1(this_00);
                        bVar2 = IR::Opnd::IsEqual(&pRVar5->super_Opnd,pOVar3);
                        if (bVar2) {
                          pOVar3 = IR::Instr::GetSrc1(this_00);
                          pRVar5 = IR::Opnd::AsRegOpnd(pOVar3);
                          bVar2 = IR::Opnd::GetIsDead(&pRVar5->super_Opnd);
                        }
                        else {
                          pOVar3 = IR::Instr::GetSrc2(this_00);
                          bVar2 = IR::Opnd::IsEqual(&pRVar5->super_Opnd,pOVar3);
                          if (!bVar2) {
                            return instrBr;
                          }
                          pOVar3 = IR::Instr::GetSrc2(this_00);
                          pRVar5 = IR::Opnd::AsRegOpnd(pOVar3);
                          bVar2 = IR::Opnd::GetIsDead(&pRVar5->super_Opnd);
                        }
                        if (bVar2) {
                          bVar2 = IR::Instr::HasBailOutInfo(this_02);
                          if (bVar2) {
                            AssertCount = AssertCount + 1;
                            Js::Throw::LogAssert();
                            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                            *puVar7 = 1;
                            bVar2 = Js::Throw::ReportAssert
                                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                               ,0x184,"(!instrCm1->HasBailOutInfo())",
                                               "!instrCm1->HasBailOutInfo()");
                            if (!bVar2) {
                              pcVar1 = (code *)invalidInstructionException();
                              (*pcVar1)();
                            }
                            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                            *puVar7 = 0;
                          }
                          pBVar6 = IR::Instr::AsBranchInstr(instrBr);
                          targetInstr = IR::BranchInstr::GetTarget(pBVar6);
                          local_d8 = IR::LabelInstr::New(Label,this->m_func,false);
                          IR::Instr::InsertAfter(instrBr,&local_d8->super_Instr);
                          if (this_00->m_opcode == And_I4) {
                            local_c8 = local_d8;
                            if (instrBr->m_opcode == BrFalse_I4) {
                              local_c8 = targetInstr;
                            }
                            pBVar6 = IR::Instr::ChangeCmCCToBranchInstr(this_02,local_c8);
                            IR::BranchInstr::Invert(pBVar6);
                            local_78 = (Lowerer *)
                                       IR::Instr::ChangeCmCCToBranchInstr(this_01,targetInstr);
                            if (instrBr->m_opcode == BrFalse_I4) {
                              IR::BranchInstr::Invert((BranchInstr *)local_78);
                            }
                          }
                          else {
                            if (this_00->m_opcode != Or_I4) {
                              AssertCount = AssertCount + 1;
                              Js::Throw::LogAssert();
                              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                              *puVar7 = 1;
                              bVar2 = Js::Throw::ReportAssert
                                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/PreLowerPeeps.cpp"
                                                 ,0x198,
                                                 "(instrBinOp->m_opcode == Js::OpCode::Or_I4)",
                                                 "instrBinOp->m_opcode == Js::OpCode::Or_I4");
                              if (!bVar2) {
                                pcVar1 = (code *)invalidInstructionException();
                                (*pcVar1)();
                              }
                              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                              *puVar7 = 0;
                            }
                            if (instrBr->m_opcode == BrTrue_I4) {
                              local_d8 = targetInstr;
                            }
                            IR::Instr::ChangeCmCCToBranchInstr(this_02,local_d8);
                            local_78 = (Lowerer *)
                                       IR::Instr::ChangeCmCCToBranchInstr(this_01,targetInstr);
                            if (instrBr->m_opcode == BrFalse_I4) {
                              IR::BranchInstr::Invert((BranchInstr *)local_78);
                            }
                          }
                          IR::Instr::Remove(this_00);
                          IR::Instr::Remove(instrBr);
                          this_local = local_78;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr *Lowerer::PeepBrBool(IR::Instr *instrBr)
{
    IR::Opnd *src1;
    IR::Instr *instrBinOp, *instrCm1, *instrCm2;

    // Peep:
    //    t1 = CmCC_I4 a, b
    //    t2 = CmCC_i4 c, d
    //    t3 = AND/OR t1, t2
    //    BrTrue/False t3, $L_true
    //
    // Into:
    //    BrCC a, b,  $L_true/false
    //    BrCC c, d,  $L_true
    //$L_false:

    src1 = instrBr->GetSrc1();
    if (!src1->IsRegOpnd())
    {
        return instrBr;
    }
    Assert(!instrBr->HasBailOutInfo());

    instrBinOp = instrBr->GetPrevRealInstrOrLabel();
    if (instrBinOp->m_opcode != Js::OpCode::And_I4 && instrBinOp->m_opcode != Js::OpCode::Or_I4)
    {
        return instrBr;
    }
    if (!instrBinOp->GetDst()->IsEqual(src1))
    {
        return instrBr;
    }
    IR::RegOpnd *src1Reg = src1->AsRegOpnd();
    if (!src1Reg->m_sym->IsSingleDef() || !src1Reg->GetIsDead())
    {
        return instrBr;
    }
    Assert(!instrBinOp->HasBailOutInfo());

    instrCm2 = instrBinOp->GetPrevRealInstrOrLabel();
    if (!instrCm2->IsCmCC_I4())
    {
        return instrBr;
    }
    IR::RegOpnd *cm2DstReg = instrCm2->GetDst()->AsRegOpnd();
    if (!cm2DstReg->m_sym->IsSingleDef())
    {
        return instrBr;
    }
    if (cm2DstReg->IsEqual(instrBinOp->GetSrc1()))
    {
        if (!instrBinOp->GetSrc1()->AsRegOpnd()->GetIsDead())
        {
            return instrBr;
        }
    }
    else if (cm2DstReg->IsEqual(instrBinOp->GetSrc2()))
    {
        if (!instrBinOp->GetSrc2()->AsRegOpnd()->GetIsDead())
        {
            return instrBr;
        }
    }
    else
    {
        return instrBr;
    }

    Assert(!instrCm2->HasBailOutInfo());

    instrCm1 = instrCm2->GetPrevRealInstrOrLabel();
    if (!instrCm1->IsCmCC_I4())
    {
        return instrBr;
    }
    Assert(!instrCm1->GetDst()->IsEqual(instrCm2->GetDst()));

    IR::RegOpnd *cm1DstReg = instrCm1->GetDst()->AsRegOpnd();
    if (!cm1DstReg->m_sym->IsSingleDef())
    {
        return instrBr;
    }
    if (cm1DstReg->IsEqual(instrCm2->GetSrc1()) || cm1DstReg->IsEqual(instrCm2->GetSrc2()))
    {
        return instrBr;
    }
    if (cm1DstReg->IsEqual(instrBinOp->GetSrc1()))
    {
        if (!instrBinOp->GetSrc1()->AsRegOpnd()->GetIsDead())
        {
            return instrBr;
        }
    }
    else if (cm1DstReg->IsEqual(instrBinOp->GetSrc2()))
    {
        if (!instrBinOp->GetSrc2()->AsRegOpnd()->GetIsDead())
        {
            return instrBr;
        }
    }
    else
    {
        return instrBr;
    }

    Assert(!instrCm1->HasBailOutInfo());

    IR::LabelInstr *falseLabel = instrBr->AsBranchInstr()->GetTarget();
    IR::LabelInstr *trueLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instrBr->InsertAfter(trueLabel);
    IR::BranchInstr *instrBr1;
    IR::BranchInstr *instrBr2;

    if (instrBinOp->m_opcode == Js::OpCode::And_I4)
    {
        instrBr1 = instrCm1->ChangeCmCCToBranchInstr(instrBr->m_opcode == Js::OpCode::BrFalse_I4 ? falseLabel : trueLabel);
        instrBr1->Invert();
        instrBr2 = instrCm2->ChangeCmCCToBranchInstr(falseLabel);
        if (instrBr->m_opcode == Js::OpCode::BrFalse_I4)
        {
            instrBr2->Invert();
        }
    }
    else
    {
        Assert(instrBinOp->m_opcode == Js::OpCode::Or_I4);

        instrBr1 = instrCm1->ChangeCmCCToBranchInstr(instrBr->m_opcode == Js::OpCode::BrTrue_I4 ? falseLabel : trueLabel);
        instrBr2 = instrCm2->ChangeCmCCToBranchInstr(falseLabel);
        if (instrBr->m_opcode == Js::OpCode::BrFalse_I4)
        {
            instrBr2->Invert();
        }
    }

    instrBinOp->Remove();
    instrBr->Remove();

    return instrBr2;
}